

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

int jsmn_parse(jsmn_parser *parser,char *js,size_t len,jsmntok_t *tokens,size_t num_tokens)

{
  uint uVar1;
  jsmntok_t *pjVar2;
  byte bVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  int *piVar8;
  uint uVar9;
  uint uVar10;
  uint uVar12;
  long lVar13;
  uint uVar14;
  jsmntype_t jVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar11;
  
  uVar9 = parser->pos;
  uVar17 = parser->toknext;
  uVar18 = uVar17;
  uVar14 = uVar17;
  uVar12 = uVar17;
joined_r0x0016a3c6:
  uVar21 = (ulong)uVar9;
  if (uVar21 < len) {
    bVar3 = js[uVar21];
    uVar10 = uVar9;
    if (0x1f < bVar3) {
      uVar20 = 0xfffffffe;
      switch(bVar3) {
      case 0x21:
      case 0x23:
      case 0x24:
      case 0x25:
      case 0x26:
      case 0x27:
      case 0x28:
      case 0x29:
      case 0x2a:
      case 0x2b:
      case 0x2e:
      case 0x2f:
        goto switchD_0016a43e_caseD_21;
      case 0x22:
        uVar20 = uVar9 + 1;
        uVar21 = (ulong)uVar20;
        parser->pos = uVar20;
        uVar10 = uVar20;
        if (uVar21 < len) {
          do {
            cVar4 = js[uVar21];
            uVar11 = uVar10;
            if (cVar4 == '\\') {
              uVar1 = uVar10 + 1;
              if (uVar1 < len) {
                parser->pos = uVar1;
                bVar3 = js[uVar1];
                uVar11 = uVar1;
                if ((0x37 < bVar3 - 0x2f) ||
                   ((0x88200000000001U >> ((ulong)(bVar3 - 0x2f) & 0x3f) & 1) == 0)) {
                  iVar6 = -2;
                  switch(bVar3) {
                  case 0x6e:
                  case 0x72:
                  case 0x74:
                    break;
                  case 0x6f:
                  case 0x70:
                  case 0x71:
                  case 0x73:
                    goto switchD_0016a4ba_caseD_6f;
                  case 0x75:
                    uVar10 = uVar10 + 2;
                    parser->pos = uVar10;
                    iVar19 = 4;
                    do {
                      if ((len <= uVar10) || (bVar3 = js[uVar10], bVar3 == 0)) break;
                      if ((9 < (byte)(bVar3 - 0x30)) &&
                         ((0x25 < bVar3 - 0x41 ||
                          ((0x3f0000003fU >> ((ulong)(bVar3 - 0x41) & 0x3f) & 1) == 0))))
                      goto switchD_0016a4ba_caseD_6f;
                      uVar10 = uVar10 + 1;
                      parser->pos = uVar10;
                      iVar19 = iVar19 + -1;
                    } while (iVar19 != 0);
                    uVar11 = uVar10 - 1;
                    break;
                  default:
                    if (bVar3 != 0x22) goto switchD_0016a4ba_caseD_6f;
                  }
                }
              }
            }
            else {
              if (cVar4 == '\0') break;
              if (cVar4 == '\"') goto LAB_0016a7f0;
            }
            uVar10 = uVar11 + 1;
            uVar21 = (ulong)uVar10;
            parser->pos = uVar10;
            if (len <= uVar21) break;
          } while( true );
        }
        iVar6 = -3;
        goto switchD_0016a4ba_caseD_6f;
      case 0x2c:
        if (((tokens != (jsmntok_t *)0x0) && (lVar13 = (long)parser->toksuper, lVar13 != -1)) &&
           (1 < tokens[lVar13].type - JSMN_OBJECT)) {
          parser->toksuper = tokens[lVar13].parent;
        }
      case 0x20:
switchD_0016a43e_caseD_20:
        goto LAB_0016a40b;
      case 0x2d:
      case 0x30:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
switchD_0016a43e_caseD_2d:
        if ((tokens != (jsmntok_t *)0x0) && (lVar13 = (long)parser->toksuper, lVar13 != -1)) {
          if (tokens[lVar13].type == JSMN_STRING) {
            if (tokens[lVar13].size != 0) {
              return -2;
            }
          }
          else if (tokens[lVar13].type == JSMN_OBJECT) {
            return -2;
          }
        }
        do {
          bVar3 = js[uVar21];
          uVar16 = (ulong)bVar3;
          iVar6 = -3;
          iVar19 = (int)uVar21;
          if (uVar16 < 0x2d) {
            if ((0x100100002600U >> (uVar16 & 0x3f) & 1) != 0) goto LAB_0016a692;
            if (uVar16 == 0) goto switchD_0016a4ba_caseD_6f;
          }
          if ((bVar3 == 0x5d) || (bVar3 == 0x7d)) goto LAB_0016a692;
          if ((byte)(bVar3 + 0x81) < 0xa1) {
            iVar6 = -2;
            goto switchD_0016a4ba_caseD_6f;
          }
          uVar21 = (ulong)(iVar19 + 1U);
          parser->pos = iVar19 + 1U;
          if (len <= uVar21) goto switchD_0016a4ba_caseD_6f;
        } while( true );
      case 0x3a:
        parser->toksuper = uVar17 - 1;
        uVar18 = uVar17;
        goto LAB_0016a40b;
      default:
        uVar20 = bVar3 - 0x5b;
        uVar16 = (ulong)uVar20;
        if (0x22 < uVar20) {
          return -2;
        }
        if ((0x2080800UL >> (uVar16 & 0x3f) & 1) != 0) goto switchD_0016a43e_caseD_2d;
        if ((0x100000001U >> (uVar16 & 0x3f) & 1) == 0) {
          if ((0x400000004U >> (uVar16 & 0x3f) & 1) == 0) {
            return -2;
          }
          if (tokens == (jsmntok_t *)0x0) goto switchD_0016a43e_caseD_20;
          if (uVar12 == 0) {
            return -2;
          }
          jVar15 = (bVar3 != 0x7d) + JSMN_OBJECT;
          uVar21 = (ulong)(uVar12 - 1);
          do {
            pjVar2 = tokens + uVar21;
            uVar17 = uVar12;
            uVar18 = uVar12;
            if ((pjVar2->start != -1) && (pjVar2->end == -1)) {
              if (pjVar2->type != jVar15) {
                return -2;
              }
              pjVar2->end = uVar9 + 1;
              parser->toksuper = pjVar2->parent;
              goto LAB_0016a40b;
            }
            uVar21 = (ulong)pjVar2->parent;
          } while (uVar21 != 0xffffffffffffffff);
          if (pjVar2->type != jVar15) {
            return -2;
          }
          if (parser->toksuper == -1) {
            return -2;
          }
        }
        else {
          uVar14 = uVar14 + 1;
          if (tokens == (jsmntok_t *)0x0) goto switchD_0016a43e_caseD_20;
          if (num_tokens <= uVar12) {
            return -1;
          }
          uVar17 = uVar12 + 1;
          parser->toknext = uVar17;
          pjVar2 = tokens + uVar12;
          pjVar2->end = -1;
          pjVar2->size = 0;
          pjVar2->parent = -1;
          iVar6 = parser->toksuper;
          if ((long)iVar6 != -1) {
            tokens[iVar6].size = tokens[iVar6].size + 1;
            pjVar2->parent = iVar6;
          }
          pjVar2->type = (bVar3 != 0x7b) + JSMN_OBJECT;
          pjVar2->start = uVar9;
          parser->toksuper = uVar12;
          uVar18 = uVar17;
          uVar12 = uVar17;
        }
        goto LAB_0016a40b;
      }
    }
    if ((bVar3 - 9 < 2) || (bVar3 == 0xd)) goto switchD_0016a43e_caseD_20;
    if (bVar3 != 0) {
      return -2;
    }
  }
  uVar20 = uVar14;
  if ((tokens != (jsmntok_t *)0x0) && (uVar12 = uVar12 - 1, -1 < (int)uVar12)) {
    piVar8 = &tokens[uVar12].end;
    lVar13 = (ulong)uVar12 + 1;
    do {
      if ((piVar8[-1] != -1) && (*piVar8 == -1)) {
        return -3;
      }
      piVar8 = piVar8 + -5;
      lVar7 = lVar13 + -1;
      bVar5 = 0 < lVar13;
      lVar13 = lVar7;
    } while (lVar7 != 0 && bVar5);
  }
switchD_0016a43e_caseD_21:
  return uVar20;
LAB_0016a692:
  if (tokens == (jsmntok_t *)0x0) {
    parser->pos = iVar19 - 1;
  }
  else {
    uVar21 = (ulong)uVar18;
    if (num_tokens <= uVar21) goto LAB_0016a8b7;
    uVar17 = uVar18 + 1;
    parser->toknext = uVar17;
    tokens[uVar21].type = JSMN_PRIMITIVE;
    tokens[uVar21].start = uVar9;
    tokens[uVar21].end = iVar19;
    tokens[uVar21].size = 0;
    iVar6 = parser->toksuper;
    tokens[uVar21].parent = iVar6;
    parser->pos = iVar19 - 1;
    uVar18 = uVar17;
    uVar12 = uVar17;
    if ((long)iVar6 != -1) {
      tokens[iVar6].size = tokens[iVar6].size + 1;
    }
  }
  uVar14 = uVar14 + 1;
  uVar10 = iVar19 - 1;
  goto LAB_0016a40b;
LAB_0016a7f0:
  if (tokens != (jsmntok_t *)0x0) {
    uVar21 = (ulong)uVar17;
    if (num_tokens <= uVar21) {
LAB_0016a8b7:
      iVar6 = -1;
switchD_0016a4ba_caseD_6f:
      parser->pos = uVar9;
      return iVar6;
    }
    uVar17 = uVar17 + 1;
    parser->toknext = uVar17;
    tokens[uVar21].type = JSMN_STRING;
    tokens[uVar21].start = uVar20;
    tokens[uVar21].end = uVar10;
    tokens[uVar21].size = 0;
    iVar6 = parser->toksuper;
    tokens[uVar21].parent = iVar6;
    uVar18 = uVar17;
    uVar12 = uVar17;
    if ((long)iVar6 != -1) {
      tokens[iVar6].size = tokens[iVar6].size + 1;
    }
  }
  uVar14 = uVar14 + 1;
LAB_0016a40b:
  uVar9 = uVar10 + 1;
  parser->pos = uVar9;
  goto joined_r0x0016a3c6;
}

Assistant:

static int jsmn_parse(jsmn_parser *parser, const char *js, size_t len,
                      jsmntok_t *tokens, size_t num_tokens) {
    int r;
    int i;
    jsmntok_t *token;
    int count = parser->toknext;

    for (; parser->pos < len && js[parser->pos] != '\0'; parser->pos++) {
        char c;
        jsmntype_t type;

        c = js[parser->pos];
        switch (c) {
            case '{': case '[':
                count++;
                if (tokens == NULL) {
                    break;
                }
                token = jsmn_alloc_token(parser, tokens, num_tokens);
                if (token == NULL)
                    return JSMN_ERROR_NOMEM;
                if (parser->toksuper != -1) {
                    tokens[parser->toksuper].size++;
#ifdef JSMN_PARENT_LINKS
                    token->parent = parser->toksuper;
#endif
                }
                token->type = (c == '{' ? JSMN_OBJECT : JSMN_ARRAY);
                token->start = parser->pos;
                parser->toksuper = parser->toknext - 1;
                break;
            case '}': case ']':
                if (tokens == NULL)
                    break;
                type = (c == '}' ? JSMN_OBJECT : JSMN_ARRAY);
#ifdef JSMN_PARENT_LINKS
                if (parser->toknext < 1) {
                    return JSMN_ERROR_INVAL;
                }
                token = &tokens[parser->toknext - 1];
                for (;;) {
                    if (token->start != -1 && token->end == -1) {
                        if (token->type != type) {
                            return JSMN_ERROR_INVAL;
                        }
                        token->end = parser->pos + 1;
                        parser->toksuper = token->parent;
                        break;
                    }
                    if (token->parent == -1) {
                        if(token->type != type || parser->toksuper == -1) {
                            return JSMN_ERROR_INVAL;
                        }
                        break;
                    }
                    token = &tokens[token->parent];
                }
#else
                for (i = parser->toknext - 1; i >= 0; i--) {
				token = &tokens[i];
				if (token->start != -1 && token->end == -1) {
					if (token->type != type) {
						return JSMN_ERROR_INVAL;
					}
					parser->toksuper = -1;
					token->end = parser->pos + 1;
					break;
				}
			}
			/* Error if unmatched closing bracket */
			if (i == -1) return JSMN_ERROR_INVAL;
			for (; i >= 0; i--) {
				token = &tokens[i];
				if (token->start != -1 && token->end == -1) {
					parser->toksuper = i;
					break;
				}
			}
#endif
                break;
            case '\"':
                r = jsmn_parse_string(parser, js, len, tokens, num_tokens);
                if (r < 0) return r;
                count++;
                if (parser->toksuper != -1 && tokens != NULL)
                    tokens[parser->toksuper].size++;
                break;
            case '\t' : case '\r' : case '\n' : case ' ':
                break;
            case ':':
                parser->toksuper = parser->toknext - 1;
                break;
            case ',':
                if (tokens != NULL && parser->toksuper != -1 &&
                    tokens[parser->toksuper].type != JSMN_ARRAY &&
                    tokens[parser->toksuper].type != JSMN_OBJECT) {
#ifdef JSMN_PARENT_LINKS
                    parser->toksuper = tokens[parser->toksuper].parent;
#else
                    for (i = parser->toknext - 1; i >= 0; i--) {
					if (tokens[i].type == JSMN_ARRAY || tokens[i].type == JSMN_OBJECT) {
						if (tokens[i].start != -1 && tokens[i].end == -1) {
							parser->toksuper = i;
							break;
						}
					}
				}
#endif
                }
                break;
#ifdef JSMN_STRICT
                /* In strict mode primitives are: numbers and booleans */
            case '-': case '0': case '1' : case '2': case '3' : case '4':
            case '5': case '6': case '7' : case '8': case '9':
            case 't': case 'f': case 'n' :
                /* And they must not be keys of the object */
                if (tokens != NULL && parser->toksuper != -1) {
                    jsmntok_t *t = &tokens[parser->toksuper];
                    if (t->type == JSMN_OBJECT ||
                        (t->type == JSMN_STRING && t->size != 0)) {
                        return JSMN_ERROR_INVAL;
                    }
                }
#else
                /* In non-strict mode every unquoted value is a primitive */
		default:
#endif
                r = jsmn_parse_primitive(parser, js, len, tokens, num_tokens);
                if (r < 0) return r;
                count++;
                if (parser->toksuper != -1 && tokens != NULL)
                    tokens[parser->toksuper].size++;
                break;

#ifdef JSMN_STRICT
                /* Unexpected char in strict mode */
            default:
                return JSMN_ERROR_INVAL;
#endif
        }
    }

    if (tokens != NULL) {
        for (i = parser->toknext - 1; i >= 0; i--) {
            /* Unmatched opened object or array */
            if (tokens[i].start != -1 && tokens[i].end == -1) {
                return JSMN_ERROR_PART;
            }
        }
    }

    return count;
}